

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::get_optimal_tile_mnk(int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  float fVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  
  uVar3 = get_cpu_level2_cache_size();
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  if ((long)(int)uVar3 < 0) {
    fVar7 = (float)((ulong)(uVar3 & 1) | (ulong)(long)(int)uVar3 >> 1);
    fVar7 = fVar7 + fVar7;
  }
  else {
    fVar7 = (float)(int)uVar3;
  }
  fVar1 = fVar7 * 0.25;
  auVar2 = vsqrtss_avx(ZEXT416((uint)(fVar7 * 0.083333336)),ZEXT416((uint)(fVar7 * 0.083333336)));
  uVar4 = (uint)auVar2._0_4_;
  uVar3 = uVar4 + 7;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar3 = uVar3 & 0xfffffff8;
  if ((int)uVar3 < 9) {
    uVar3 = 8;
  }
  *TILE_M = uVar3;
  iVar5 = get_physical_cpu_count();
  if (nT <= iVar5) {
    iVar5 = nT;
  }
  uVar6 = iVar5 * *TILE_M;
  iVar5 = (int)(M + uVar6 + -1) / (int)uVar6;
  iVar5 = (M + iVar5 + -1) / iVar5;
  uVar4 = iVar5 + 7;
  uVar3 = iVar5 + 0xe;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar4 = uVar3 & 0xfffffff8;
  if ((int)uVar6 <= (int)(uVar3 & 0xfffffff8)) {
    uVar4 = uVar6;
  }
  uVar3 = uVar4;
  if (1 < nT) {
    iVar5 = 1;
    if (1 < (int)uVar4 / nT) {
      iVar5 = (int)uVar4 / nT;
    }
    uVar3 = iVar5 + 7U & 0x7ffffff8;
    if ((int)uVar4 <= (int)uVar3) {
      uVar3 = uVar4;
    }
  }
  *TILE_M = uVar3;
  auVar2 = vsqrtss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  uVar4 = (uint)(auVar2._0_4_ - (float)(int)uVar3);
  uVar3 = uVar4 + 7;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar4 = 8;
  if (8 < (int)(uVar3 & 0xfffffff8)) {
    uVar4 = uVar3 & 0xfffffff8;
  }
  iVar5 = (int)(uVar4 + K + -1) / (int)uVar4;
  iVar5 = (iVar5 + K + -1) / iVar5;
  uVar6 = iVar5 + 7;
  uVar3 = iVar5 + 0xe;
  if (-1 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar6 = uVar3 & 0xfffffff8;
  if ((int)uVar4 <= (int)(uVar3 & 0xfffffff8)) {
    uVar6 = uVar4;
  }
  *TILE_K = uVar6;
  if (0 < N) {
    uVar4 = (uint)((fVar1 - (float)(int)(*TILE_M * uVar6)) / (float)(int)(*TILE_M + uVar6));
    uVar3 = uVar4 + 3;
    if (-1 < (int)uVar4) {
      uVar3 = uVar4;
    }
    uVar4 = 4;
    if (4 < (int)(uVar3 & 0xfffffffc)) {
      uVar4 = uVar3 & 0xfffffffc;
    }
    iVar5 = (int)(N + uVar4 + -1) / (int)uVar4;
    iVar5 = (N + iVar5 + -1) / iVar5;
    uVar6 = iVar5 + 3;
    uVar3 = iVar5 + 6;
    if (-1 < (int)uVar6) {
      uVar3 = uVar6;
    }
    uVar6 = uVar3 & 0xfffffffc;
    if ((int)uVar4 <= (int)(uVar3 & 0xfffffffc)) {
      uVar6 = uVar4;
    }
    *TILE_N = uVar6;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve M
    {
        int tile_size = (int)sqrt((float)l2_cache_size / sizeof(float) / 3);

#if __AVX512F__
        TILE_M = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, tile_size / 4 * 4);
#else
        TILE_M = std::max(2, tile_size / 2 * 2);
#endif

        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    // solve K
    {
        int tile_size = (int)(sqrt((float)l2_cache_size / sizeof(float)) - TILE_M);

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int tile_size = (int)(((float)l2_cache_size / sizeof(float) - TILE_M * TILE_K) / (TILE_M + TILE_K));

#if __AVX512F__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }
}